

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
VectorInstance::op_removeFirst_fromIndex
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  pointer psVar1;
  bool bVar2;
  pointer psVar3;
  undefined8 *puVar4;
  IntegerInstance *this_00;
  const_iterator __position;
  shared_ptr<Instance> instance;
  IntegerInstance local_88;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start != 0x40) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  get_shared_instance((string *)&instance,&this->_element_type);
  IntegerInstance::IntegerInstance
            (&local_88,
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1);
  this_00 = &local_88;
  CharacterInstance::~CharacterInstance((CharacterInstance *)this_00);
  if (-1 < (long)local_88._value) {
    psVar1 = (this->_value).
             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this->_value).
             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_88._value <= (int)((ulong)((long)psVar3 - (long)psVar1) >> 4)) {
      __position._M_current = psVar1 + local_88._value;
      do {
        if (__position._M_current == psVar3) {
LAB_00156d12:
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"null",(allocator *)&local_88);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&instance.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
          ;
          return __return_storage_ptr__;
        }
        bVar2 = InstanceIsEqualToComparator::operator()
                          ((InstanceIsEqualToComparator *)this_00,__position._M_current,&instance);
        if (bVar2) {
          std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::erase
                    (&this->_value,__position);
          goto LAB_00156d12;
        }
        __position._M_current = __position._M_current + 1;
        psVar3 = (this->_value).
                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while( true );
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "RuntimeError: invalid argument.";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

std::string VectorInstance::op_removeFirst_fromIndex(const std::vector<std::string>& arguments) {
    if (arguments.size() != 2)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> instance = get_shared_instance(_element_type, arguments[0]);
    int from_index = IntegerInstance(arguments[1]).value();
    if (from_index < 0 || from_index > int(_value.size()))
        throw EXC_INVALID_ARGUMENT;
    for (auto it = _value.begin() + from_index; it != _value.end(); it++)
        if (InstanceIsEqualToComparator()(*it, instance)) {
            _value.erase(it);
            break;
        }
    return "null";
}